

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

bool32 rw::d3d::imageFindRasterFormat
                 (Image *img,int32 type,int32 *pWidth,int32 *pHeight,int32 *pDepth,int32 *pFormat)

{
  int iVar1;
  int32 iVar2;
  int32 iVar3;
  uint uVar4;
  bool32 bVar5;
  int iVar6;
  
  iVar1 = img->depth;
  iVar6 = 0x20;
  if (isP8supported != 0) {
    iVar6 = iVar1;
  }
  if (8 < iVar1) {
    iVar6 = iVar1;
  }
  uVar4 = iVar6 << 0x1e | iVar6 - 4U >> 2;
  if (uVar4 < 8) {
    iVar2 = img->width;
    iVar3 = img->height;
    switch(uVar4) {
    case 0:
      uVar4 = 0x4500;
      break;
    case 1:
      uVar4 = 0x2500;
      break;
    default:
      goto switchD_00116bac_caseD_2;
    case 3:
      uVar4 = 0x100;
      break;
    case 5:
      uVar4 = 0x600;
      break;
    case 7:
      bVar5 = Image::hasAlpha(img);
      if (bVar5 == 0) {
        iVar6 = 0x18;
      }
      uVar4 = (uint)(bVar5 == 0) * 0x100 + 0x500;
    }
    *pWidth = iVar2;
    *pHeight = iVar3;
    *pDepth = iVar6;
    *pFormat = uVar4 | type;
    bVar5 = 1;
  }
  else {
switchD_00116bac_caseD_2:
    imageFindRasterFormat();
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

bool32
imageFindRasterFormat(Image *img, int32 type,
	int32 *pWidth, int32 *pHeight, int32 *pDepth, int32 *pFormat)
{
	int32 width, height, depth, format;

	assert((type&0xF) == Raster::TEXTURE);

//	for(width = 1; width < img->width; width <<= 1);
//	for(height = 1; height < img->height; height <<= 1);
	// Perhaps non-power-of-2 textures are acceptable?
	width = img->width;
	height = img->height;

	depth = img->depth;

	if(depth <= 8 && !isP8supported)
		depth = 32;

	switch(depth){
	case 32:
		if(img->hasAlpha())
			format = Raster::C8888;
		else{
			format = Raster::C888;
			depth = 24;
		}
		break;
	case 24:
		format = Raster::C888;
		break;
	case 16:
		format = Raster::C1555;
		break;
	case 8:
		format = Raster::PAL8 | Raster::C8888;
		break;
	case 4:
		format = Raster::PAL4 | Raster::C8888;
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	format |= type;

	*pWidth = width;
	*pHeight = height;
	*pDepth = depth;
	*pFormat = format;

	return 1;
}